

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

size_t __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::format_va
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *formatString,axl_va_list *va
          )

{
  int iVar1;
  C *pCVar2;
  size_t length;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 local_30;
  
  local_68 = *(undefined8 *)va;
  uStack_60 = *(undefined8 *)&va->field_0x8;
  local_58 = *(undefined8 *)&va->field_0x10;
  local_50 = '\x01';
  iVar1 = vsnprintf((char *)0x0,0,formatString,&local_68);
  length = (size_t)iVar1;
  if (local_50 == '\x01') {
    local_50 = '\0';
  }
  pCVar2 = createBuffer(this,length,false);
  if (pCVar2 == (C *)0x0) {
    length = 0xffffffffffffffff;
  }
  else {
    local_48 = *(undefined8 *)va;
    uStack_40 = *(undefined8 *)&va->field_0x8;
    local_38 = *(undefined8 *)&va->field_0x10;
    local_30 = 1;
    vsnprintf((this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p,length + 1,
              formatString,&local_48);
  }
  return length;
}

Assistant:

size_t
	format_va(
		const C* formatString,
		axl_va_list va
	) {
		size_t length = Details::calcFormatLength_va(formatString, va);
		if (!createBuffer(length, false))
			return -1;

		Details::format_va(this->m_p, length + 1, formatString, va);
		return length;
	}